

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kvtree.c
# Opt level: O0

kvtree * kvtree_extract(kvtree *hash,char *key)

{
  kvtree_elem *elem_00;
  kvtree *elem_hash;
  kvtree_elem *elem;
  char *key_local;
  kvtree *hash_local;
  
  if (hash == (kvtree *)0x0) {
    hash_local = (kvtree *)0x0;
  }
  else {
    elem_00 = kvtree_elem_extract(hash,key);
    if (elem_00 == (kvtree_elem *)0x0) {
      hash_local = (kvtree *)0x0;
    }
    else {
      hash_local = elem_00->hash;
      elem_00->hash = (kvtree_struct *)0x0;
      kvtree_elem_delete(elem_00);
    }
  }
  return hash_local;
}

Assistant:

kvtree* kvtree_extract(kvtree* hash, const char* key)
{
  if (hash == NULL) {
    return NULL;
  }

  kvtree_elem* elem = kvtree_elem_extract(hash, key);
  if (elem != NULL) {
    kvtree* elem_hash = elem->hash;
    elem->hash = NULL;
    kvtree_elem_delete(elem);
    return elem_hash;
  }
  return NULL;
}